

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

sunrealtype N_VMaxNormLocal_ManyVector(N_Vector x)

{
  long *in_RDI;
  sunrealtype lmax;
  sunrealtype max;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  double local_38;
  double local_30;
  double local_20;
  long local_18;
  
  local_20 = 0.0;
  for (local_18 = 0; local_18 < *(long *)*in_RDI; local_18 = local_18 + 1) {
    if (*(long *)(*(long *)(*(long *)(*(long *)(*in_RDI + 0x10) + local_18 * 8) + 8) + 0x148) == 0)
    {
      local_38 = (double)N_VMaxNorm(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_18 * 8));
      if (local_38 < local_20) {
        local_38 = local_20;
      }
      local_20 = local_38;
    }
    else {
      local_30 = (double)N_VMaxNormLocal(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_18 * 8));
      if (local_30 < local_20) {
        local_30 = local_20;
      }
      local_20 = local_30;
    }
  }
  return local_20;
}

Assistant:

sunrealtype MVAPPEND(N_VMaxNormLocal)(N_Vector x)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunrealtype max, lmax;

  /* initialize output*/
  max = ZERO;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* check for nvmaxnormlocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvmaxnormlocal)
    {
      lmax = N_VMaxNormLocal(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();
      max = (max > lmax) ? max : lmax;

      /* otherwise, call nvmaxnorm and accumulate to overall max */
    }
    else
    {
      lmax = N_VMaxNorm(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();
      max = (max > lmax) ? max : lmax;
    }
  }

  return (max);
}